

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCheck.c
# Opt level: O2

int Abc_NtkIsAcyclicHierarchy(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  Abc_Des_t *pAVar1;
  void *pvVar2;
  int iVar3;
  int i;
  
  if ((pNtk->ntkType == ABC_NTK_NETLIST) && (pAVar1 = pNtk->pDesign, pAVar1 != (Abc_Des_t *)0x0)) {
    for (iVar3 = 0; iVar3 < pAVar1->vModules->nSize; iVar3 = iVar3 + 1) {
      pvVar2 = Vec_PtrEntry(pAVar1->vModules,iVar3);
      *(undefined8 *)((long)pvVar2 + 0xc0) = 0;
      pAVar1 = pNtk->pDesign;
    }
    pNtk->fHiePath = 1;
    iVar3 = Abc_NtkIsAcyclicHierarchy_rec(pNtk);
    pNtk->fHiePath = 0;
    for (i = 0; p = pNtk->pDesign->vModules, i < p->nSize; i = i + 1) {
      pvVar2 = Vec_PtrEntry(p,i);
      *(undefined8 *)((long)pvVar2 + 0xc0) = 0;
    }
    return iVar3;
  }
  __assert_fail("Abc_NtkIsNetlist(pNtk) && pNtk->pDesign",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcCheck.c"
                ,0x332,"int Abc_NtkIsAcyclicHierarchy(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkIsAcyclicHierarchy( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pTemp;
    int i, RetValue;
    assert( Abc_NtkIsNetlist(pNtk) && pNtk->pDesign );
    // clear the modules
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pTemp, i )
        pTemp->fHieVisited = pTemp->fHiePath = 0;
    // traverse
    pNtk->fHiePath = 1;
    RetValue = Abc_NtkIsAcyclicHierarchy_rec( pNtk );
    pNtk->fHiePath = 0;
    // clear the modules
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pTemp, i )
        pTemp->fHieVisited = pTemp->fHiePath = 0;
    return RetValue;
}